

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerManager.cpp
# Opt level: O0

void __thiscall
sing::TimerManager::addTimer
          (TimerManager *this,HttpContext *context,int timeout,function<void_()> *callback)

{
  HttpContext *this_00;
  shared_ptr<sing::Timer> local_70 [2];
  duration<long,std::ratio<1l,1000l>> local_50 [8];
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_48;
  undefined1 local_40 [16];
  Sha_Timer timer;
  function<void_()> *callback_local;
  HttpContext *pHStack_18;
  int timeout_local;
  HttpContext *context_local;
  TimerManager *this_local;
  
  timer.super___shared_ptr<sing::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)callback;
  callback_local._4_4_ = timeout;
  pHStack_18 = context;
  context_local = (HttpContext *)this;
  if (context != (HttpContext *)0x0) {
    local_48.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              (local_50,(int *)((long)&callback_local + 4));
    local_40._0_8_ =
         std::chrono::operator+(&local_48,(duration<long,_std::ratio<1L,_1000L>_> *)local_50);
    std::
    make_shared<sing::Timer,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::function<void()>const&>
              ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)(local_40 + 8),(function<void_()> *)local_40);
    std::
    priority_queue<std::shared_ptr<sing::Timer>,_std::deque<std::shared_ptr<sing::Timer>,_std::allocator<std::shared_ptr<sing::Timer>_>_>,_sing::cmp>
    ::push(&this->timerQueue,(value_type *)(local_40 + 8));
    HttpContext::clearTimer(pHStack_18);
    this_00 = pHStack_18;
    std::shared_ptr<sing::Timer>::shared_ptr(local_70,(shared_ptr<sing::Timer> *)(local_40 + 8));
    HttpContext::setTimer(this_00,local_70);
    std::shared_ptr<sing::Timer>::~shared_ptr(local_70);
    std::shared_ptr<sing::Timer>::~shared_ptr((shared_ptr<sing::Timer> *)(local_40 + 8));
    return;
  }
  __assert_fail("context!=nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MisakiOfScut[P]SingHttpServer/src/Timer/TimerManager.cpp"
                ,5,
                "void sing::TimerManager::addTimer(HttpContext *, int, const std::function<void ()> &)"
               );
}

Assistant:

void TimerManager::addTimer(HttpContext* context, int timeout, const std::function<void()>& callback){
    assert(context!=nullptr);
    Sha_Timer timer = std::make_shared<Timer>(Clock::now()+MS(timeout),callback);
    timerQueue.push(timer);
    context->clearTimer();
    context->setTimer(timer);
}